

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavefront.cpp
# Opt level: O3

void __thiscall WAVEFRONT::InPlaceParser::DefaultSymbols(InPlaceParser *this)

{
  this->mHard[0x2c] = ST_HARD;
  this->mHard[0x28] = ST_HARD;
  this->mHard[0x29] = ST_HARD;
  this->mHard[0x3d] = ST_HARD;
  this->mHard[0x5b] = ST_HARD;
  this->mHard[0x5d] = ST_HARD;
  this->mHard[0x7b] = ST_HARD;
  this->mHard[0x7d] = ST_HARD;
  this->mHard[0x23] = ST_EOS;
  return;
}

Assistant:

void InPlaceParser::DefaultSymbols(void)
{
	SetHardSeparator(',');
	SetHardSeparator('(');
	SetHardSeparator(')');
	SetHardSeparator('=');
	SetHardSeparator('[');
	SetHardSeparator(']');
	SetHardSeparator('{');
	SetHardSeparator('}');
	SetCommentSymbol('#');
}